

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O2

void longvectorN(fft_data *sig,int N,int *array,int tx)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  
  uVar3 = 0;
  uVar6 = 0;
  if (0 < tx) {
    uVar6 = (ulong)(uint)tx;
  }
  iVar4 = 0;
  iVar5 = 1;
  for (; uVar3 != uVar6; uVar3 = uVar3 + 1) {
    iVar1 = ~(uint)uVar3 + tx;
    iVar2 = array[iVar1];
    iVar8 = iVar2 * iVar5;
    iVar10 = 0;
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar10 != iVar5; iVar10 = iVar10 + 1) {
      pdVar9 = &sig[iVar4].im;
      iVar11 = iVar10;
      for (iVar7 = 0; iVar7 < iVar2 + -1; iVar7 = iVar7 + 1) {
        dVar12 = (double)iVar11 * (-6.283185307179586 / (double)iVar8);
        dVar13 = cos(dVar12);
        ((fft_data *)(pdVar9 + -1))->re = dVar13;
        dVar12 = sin(dVar12);
        *pdVar9 = dVar12;
        iVar2 = array[iVar1];
        pdVar9 = pdVar9 + 2;
        iVar11 = iVar11 + iVar10;
      }
      iVar4 = iVar4 + iVar7;
    }
    iVar5 = iVar8;
  }
  return;
}

Assistant:

void longvectorN(fft_data *sig,int N, int *array, int tx) {
	int L,i,Ls,ct,j,k;
	fft_type theta;
	L = 1;
	ct = 0;
	for (i = 0; i < tx; i++) {
		L = L * array[tx-1-i];
		Ls = L / array[tx-1-i];
		theta = -1.0 * PI2/L;
		for (j = 0; j < Ls;j++) {
			for (k = 0; k < array[tx-1-i] -1 ;k++) {
				sig[ct].re = cos((k+1)*j*theta);
				sig[ct].im = sin((k+1)*j*theta);
				ct++;
			}
		}

	}

}